

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O2

int mocked_printf(FILE *file,char *format,...)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  va_list ap;
  char buffer [10000];
  
  __vsnprintf_chk(buffer,10000,1,10000,format);
  pcVar3 = output;
  sVar1 = strlen(output);
  sVar2 = strlen(buffer);
  pcVar3 = (char *)realloc(pcVar3,sVar1 + sVar2 + 1);
  strcat(pcVar3,buffer);
  output = pcVar3;
  sVar1 = strlen(pcVar3);
  return (int)sVar1;
}

Assistant:

static int mocked_printf(FILE *file, const char *format, ...) {
    char buffer[10000];
    va_list ap;
    va_start(ap, format);
    vsnprintf(buffer, sizeof(buffer), format, ap);
    va_end(ap);

    (void)file;
    output = concat(output, buffer);
    return strlen(output);
}